

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

void __thiscall
GlobOpt::SetLoopFieldInitialValue
          (GlobOpt *this,Loop *loop,Instr *instr,PropertySym *propertySym,
          PropertySym *originalPropertySym)

{
  JitArenaAllocator *pJVar1;
  JitArenaAllocator *alloc;
  code *pcVar2;
  StackSym *pSVar3;
  BOOLEAN BVar4;
  bool bVar5;
  ValueNumber VVar6;
  uint uVar7;
  uint functionId;
  uint uVar8;
  GlobOptBlockData *pGVar9;
  Value *pVVar10;
  ProfiledInstr *pPVar11;
  undefined4 *puVar12;
  ValueInfo *pVVar13;
  anon_union_2_4_ea848c7b_for_ValueType_13 *paVar14;
  BasicBlock *pBVar15;
  Instr *this_00;
  BasicBlock *local_f8;
  anon_union_2_4_ea848c7b_for_ValueType_13 *local_b8;
  Value *newValue;
  BasicBlock *block;
  BasicBlock *blockStop;
  Value *landingPadInitialValue;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_74;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_72;
  undefined1 auStack_70 [6];
  ValueType profiledValueType;
  anon_class_24_3_49332160 CanSetInitialValue;
  Value *currentObjPtrVal;
  Value *landingPadObjPtrVal;
  StackSym *objectSym;
  StackSym *symStore;
  Value *initialValue;
  PropertySym *originalPropertySym_local;
  PropertySym *propertySym_local;
  Instr *instr_local;
  Loop *loop_local;
  GlobOpt *this_local;
  
  symStore = (StackSym *)0x0;
  if ((((*(ushort *)&loop->field_0x178 >> 7 & 1) == 0) &&
      (initialValue = (Value *)originalPropertySym, originalPropertySym_local = propertySym,
      propertySym_local = (PropertySym *)instr, instr_local = (Instr *)loop,
      loop_local = (Loop *)this,
      BVar4 = BVSparse<Memory::JitArenaAllocator>::Test
                        (loop->fieldKilled,(originalPropertySym->super_Sym).m_id), BVar4 == '\0'))
     && (BVar4 = BVSparse<Memory::JitArenaAllocator>::Test
                           ((BVSparse<Memory::JitArenaAllocator> *)instr_local[2].m_src1,
                            (originalPropertySym_local->super_Sym).m_id), BVar4 == '\0')) {
    pGVar9 = CurrentBlockData(this);
    pVVar10 = GlobOptBlockData::FindValue(pGVar9,&originalPropertySym_local->super_Sym);
    if (pVVar10 == (Value *)0x0) {
      bVar5 = JsUtil::
              BaseDictionary<PropertySym*,Value*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
              ::TryGetValue<PropertySym*>
                        ((BaseDictionary<PropertySym*,Value*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                          *)(instr_local + 3),&originalPropertySym_local,(Value **)&symStore);
      if (bVar5) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar12 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0xc98,
                           "(!loop->initialValueFieldMap.TryGetValue(propertySym, &initialValue))",
                           "!loop->initialValueFieldMap.TryGetValue(propertySym, &initialValue)");
        if (!bVar5) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar12 = 0;
      }
      BVar4 = BVSparse<Memory::JitArenaAllocator>::Test
                        ((BVSparse<Memory::JitArenaAllocator> *)instr_local->m_src1[0xe]._vptr_Opnd,
                         (originalPropertySym_local->super_Sym).m_id);
      if (BVar4 == '\0') {
        landingPadObjPtrVal = (Value *)originalPropertySym_local->m_stackSym;
        currentObjPtrVal =
             GlobOptBlockData::FindValue
                       ((GlobOptBlockData *)(instr_local->m_src1 + 0xd),(Sym *)landingPadObjPtrVal);
        pGVar9 = CurrentBlockData(this);
        CanSetInitialValue.objectSym =
             (StackSym **)GlobOptBlockData::FindValue(pGVar9,(Sym *)landingPadObjPtrVal);
        _auStack_70 = &CanSetInitialValue.objectSym;
        CanSetInitialValue.currentObjPtrVal = &currentObjPtrVal;
        CanSetInitialValue.landingPadObjPtrVal = &landingPadObjPtrVal;
        bVar5 = SetLoopFieldInitialValue::anon_class_24_3_49332160::operator()
                          ((anon_class_24_3_49332160 *)auStack_70);
        if (bVar5) {
          bVar5 = IR::Instr::IsProfiledInstr((Instr *)propertySym_local);
          if (bVar5) {
            pPVar11 = IR::Instr::AsProfiledInstr((Instr *)propertySym_local);
            local_b8 = (anon_union_2_4_ea848c7b_for_ValueType_13 *)
                       IR::ProfiledInstr::anon_union_8_4_88fdcd80::FldInfo
                                 ((anon_union_8_4_88fdcd80 *)&(pPVar11->u).field_3);
          }
          else {
            local_b8 = &ValueType::Uninitialized.field_0;
          }
          local_72 = (anon_union_2_4_ea848c7b_for_ValueType_13)
                     *(anon_union_2_4_ea848c7b_for_ValueType_13 *)&local_b8->field_0;
          bVar5 = ValueType::IsDefinite((ValueType *)&local_72.field_0);
          if (bVar5) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar12 = 1;
            bVar5 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                               ,0xcd5,"(!profiledValueType.IsDefinite())",
                               "!profiledValueType.IsDefinite()");
            if (!bVar5) {
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar12 = 0;
          }
          local_74.field_0 = local_72.field_0;
          symStore = (StackSym *)
                     NewGenericValue(this,(ValueType)local_72.field_0,
                                     &originalPropertySym_local->super_Sym);
          objectSym = StackSym::New(this->func);
          pVVar13 = ::Value::GetValueInfo((Value *)symStore);
          ValueInfo::SetSymStore(pVVar13,&objectSym->super_Sym);
          pSVar3 = symStore;
          this_00 = instr_local + 3;
          pJVar1 = this->alloc;
          VVar6 = ::Value::GetValueNumber((Value *)symStore);
          landingPadInitialValue = ::Value::Copy((Value *)pSVar3,pJVar1,VVar6);
          JsUtil::
          BaseDictionary<PropertySym_*,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::Add((BaseDictionary<PropertySym_*,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                 *)this_00,&originalPropertySym_local,&landingPadInitialValue);
          pJVar1 = this->alloc;
          VVar6 = ::Value::GetValueNumber((Value *)symStore);
          alloc = this->alloc;
          pVVar13 = ::Value::GetValueInfo((Value *)symStore);
          paVar14 = &ValueInfo::Type(pVVar13)->field_0;
          pVVar13 = ValueInfo::New(alloc,(ValueType)
                                         *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
                                          &paVar14->field_0);
          pVVar10 = ::Value::New(pJVar1,VVar6,pVVar13);
          GlobOptBlockData::SetValue
                    ((GlobOptBlockData *)(instr_local->m_src1 + 0xd),pVVar10,
                     &originalPropertySym_local->super_Sym);
          BVSparse<Memory::JitArenaAllocator>::Set
                    ((BVSparse<Memory::JitArenaAllocator> *)instr_local->m_src1[0xe]._vptr_Opnd,
                     (originalPropertySym_local->super_Sym).m_id);
          uVar7 = Func::GetSourceContextId(this->func);
          functionId = Func::GetLocalFunctionId(this->func);
          bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,FieldPREPhase,uVar7,functionId);
          if (bVar5) {
            pBVar15 = Loop::GetHeadBlock((Loop *)instr_local);
            uVar8 = BasicBlock::GetBlockNum(pBVar15);
            VVar6 = ::Value::GetValueNumber((Value *)symStore);
            Output::Print(L"** TRACE:  Field PRE initial value for loop head #%d. Val:%d symStore:",
                          (ulong)uVar8,(ulong)VVar6);
            Sym::Dump(&objectSym->super_Sym,ValueType::Uninitialized);
            Output::Print(L"\n    Instr: ");
            IR::Instr::Dump((Instr *)propertySym_local);
            Output::Flush();
          }
          pBVar15 = Loop::GetHeadBlock((Loop *)instr_local);
          if (pBVar15 == (BasicBlock *)0x0) {
            local_f8 = (BasicBlock *)0x0;
          }
          else {
            pBVar15 = Loop::GetHeadBlock((Loop *)instr_local);
            local_f8 = pBVar15->prev;
          }
          for (newValue = (Value *)BasicBlock::GetPrev(this->currentBlock);
              (BasicBlock *)newValue != local_f8; newValue = (Value *)newValue->valueInfo) {
            if ((((ulong)newValue[1].valueInfo & 1) == 0) &&
               (uVar7 = BasicBlock::GetDataUseCount((BasicBlock *)newValue), pSVar3 = symStore,
               uVar7 != 0)) {
              pJVar1 = this->alloc;
              VVar6 = ::Value::GetValueNumber((Value *)symStore);
              pVVar10 = ::Value::Copy((Value *)pSVar3,pJVar1,VVar6);
              GlobOptBlockData::SetValue
                        ((GlobOptBlockData *)(newValue + 0xd),pVVar10,
                         &originalPropertySym_local->super_Sym);
              BVSparse<Memory::JitArenaAllocator>::Set
                        (*(BVSparse<Memory::JitArenaAllocator> **)(newValue + 0xe),
                         (originalPropertySym_local->super_Sym).m_id);
              GlobOptBlockData::SetValue
                        ((GlobOptBlockData *)(newValue + 0xd),pVVar10,&objectSym->super_Sym);
              BVSparse<Memory::JitArenaAllocator>::Set
                        (*(BVSparse<Memory::JitArenaAllocator> **)(newValue + 0x10),
                         (objectSym->super_Sym).m_id);
            }
          }
          pGVar9 = CurrentBlockData(this);
          GlobOptBlockData::SetValue(pGVar9,(Value *)symStore,&objectSym->super_Sym);
          pGVar9 = CurrentBlockData(this);
          BVSparse<Memory::JitArenaAllocator>::Set(pGVar9->liveVarSyms,(objectSym->super_Sym).m_id);
          pGVar9 = CurrentBlockData(this);
          BVSparse<Memory::JitArenaAllocator>::Set
                    (pGVar9->liveFields,(originalPropertySym_local->super_Sym).m_id);
        }
      }
    }
  }
  return;
}

Assistant:

void
GlobOpt::SetLoopFieldInitialValue(Loop *loop, IR::Instr *instr, PropertySym *propertySym, PropertySym *originalPropertySym)
{
    Value *initialValue = nullptr;
    StackSym *symStore;

    if (loop->allFieldsKilled || loop->fieldKilled->Test(originalPropertySym->m_id) || loop->fieldKilled->Test(propertySym->m_id))
    {
        return;
    }

    // Value already exists
    if (CurrentBlockData()->FindValue(propertySym))
    {
        return;
    }

    // If this initial value was already added, we would find in the current value table.
    Assert(!loop->initialValueFieldMap.TryGetValue(propertySym, &initialValue));

    // If propertySym is live in landingPad, we don't need an initial value.
    if (loop->landingPad->globOptData.liveFields->Test(propertySym->m_id))
    {
        return;
    }

    StackSym * objectSym = propertySym->m_stackSym;
    Value *landingPadObjPtrVal, *currentObjPtrVal;
    landingPadObjPtrVal = loop->landingPad->globOptData.FindValue(objectSym);
    currentObjPtrVal = CurrentBlockData()->FindValue(objectSym);
    
    auto CanSetInitialValue = [&]() -> bool {
        if (!currentObjPtrVal)
        {
            return false;
        }
        if (landingPadObjPtrVal)
        {
            return currentObjPtrVal->GetValueNumber() == landingPadObjPtrVal->GetValueNumber();
        }
        else
        {
            if (!objectSym->IsSingleDef())
            {
                return false;
            }
            IR::Instr * defInstr = objectSym->GetInstrDef();
            IR::Opnd * src1 = defInstr->GetSrc1();
            while (!(src1 && src1->IsSymOpnd() && src1->AsSymOpnd()->m_sym->IsPropertySym()))
            {
                if (src1 && src1->IsRegOpnd() && src1->AsRegOpnd()->GetStackSym()->IsSingleDef())
                {
                    defInstr = src1->AsRegOpnd()->GetStackSym()->GetInstrDef();
                    src1 = defInstr->GetSrc1();
                }
                else
                {
                    return false;
                }
            }

            return true;

            // Todo: allow other kinds of operands as src1 of instr def of the object sym of the current propertySym
            // SymOpnd, but not PropertySymOpnd - LdSlotArr, some LdSlots (?)
            // nullptr - NewScObject
        }
    };

    if (!CanSetInitialValue())
    {
        // objPtr has a different value in the landing pad.
        return;
    }

    // The opnd's value type has not yet been initialized. Since the property sym doesn't have a value, it effectively has an
    // Uninitialized value type. Use the profiled value type from the instruction.
    const ValueType profiledValueType =
        instr->IsProfiledInstr() ? instr->AsProfiledInstr()->u.FldInfo().valueType : ValueType::Uninitialized;
    Assert(!profiledValueType.IsDefinite()); // Hence the values created here don't need to be tracked for kills
    initialValue = this->NewGenericValue(profiledValueType, propertySym);
    symStore = StackSym::New(this->func);

    initialValue->GetValueInfo()->SetSymStore(symStore);
    loop->initialValueFieldMap.Add(propertySym, initialValue->Copy(this->alloc, initialValue->GetValueNumber()));

    // Copy the initial value into the landing pad, but without a symStore
    Value *landingPadInitialValue = Value::New(this->alloc, initialValue->GetValueNumber(),
        ValueInfo::New(this->alloc, initialValue->GetValueInfo()->Type()));
    loop->landingPad->globOptData.SetValue(landingPadInitialValue, propertySym);
    loop->landingPad->globOptData.liveFields->Set(propertySym->m_id);

#if DBG_DUMP
    if (PHASE_TRACE(Js::FieldPREPhase, this->func))
    {
        Output::Print(_u("** TRACE:  Field PRE initial value for loop head #%d. Val:%d symStore:"),
            loop->GetHeadBlock()->GetBlockNum(), initialValue->GetValueNumber());
        symStore->Dump();
        Output::Print(_u("\n    Instr: "));
        instr->Dump();
        Output::Flush();
    }
#endif

    // Add initial value to all the previous blocks in the loop.
    FOREACH_BLOCK_BACKWARD_IN_RANGE(block, this->currentBlock->GetPrev(), loop->GetHeadBlock())
    {
        if (block->GetDataUseCount() == 0)
        {
            // All successor blocks have been processed, no point in adding the value.
            continue;
        }
        Value *newValue = initialValue->Copy(this->alloc, initialValue->GetValueNumber());
        block->globOptData.SetValue(newValue, propertySym);
        block->globOptData.liveFields->Set(propertySym->m_id);
        block->globOptData.SetValue(newValue, symStore);
        block->globOptData.liveVarSyms->Set(symStore->m_id);
    } NEXT_BLOCK_BACKWARD_IN_RANGE;

    CurrentBlockData()->SetValue(initialValue, symStore);
    CurrentBlockData()->liveVarSyms->Set(symStore->m_id);
    CurrentBlockData()->liveFields->Set(propertySym->m_id);
}